

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O0

UniValue * __thiscall ExternalSigner::DisplayAddress(ExternalSigner *this,string *descriptor)

{
  long lVar1;
  allocator<char> *in_RDX;
  char *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  ExternalSigner *in_stack_fffffffffffffec0;
  UniValue *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  UniValue *this_00;
  allocator<char> local_e9 [89];
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  this_00 = in_RDI;
  std::operator+(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  NetworkArg_abi_cxx11_(in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,in_RSI,
             in_RDX);
  RunCommandParseJSON(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator(local_e9);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ExternalSigner::DisplayAddress(const std::string& descriptor) const
{
    return RunCommandParseJSON(m_command + " --fingerprint " + m_fingerprint + NetworkArg() + " displayaddress --desc " + descriptor);
}